

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_immediate_read_error_for_second_get_payload(void)

{
  cio_error cVar1;
  long lVar2;
  char data [5];
  ws_frame local_98;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  undefined2 local_60;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_size_t_cio_buffered_stream_read_handler_t_void_ptr
  *read_at_least_fakes [5];
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 8) {
      return;
    }
    local_98.frame_type = *(cio_websocket_frame_type *)((long)&DAT_00110fe0 + lVar2);
    builtin_strncpy(data,"aaaaa",5);
    local_98.direction = FROM_CLIENT;
    local_98.data = data;
    local_98.data_length = 5;
    local_98.last_frame = true;
    local_98.rsv = false;
    local_78 = 8;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = 1;
    serialize_frames(&local_98,2);
    read_at_least_fakes[4] = bs_read_at_least_immediate_error;
    read_at_least_fakes[2] = bs_read_at_least_from_buffer;
    read_at_least_fakes[3] = bs_read_at_least_from_buffer;
    read_at_least_fakes[0] = bs_read_at_least_from_buffer;
    read_at_least_fakes[1] = bs_read_at_least_from_buffer;
    cio_buffered_stream_read_at_least_fake.custom_fake_seq = read_at_least_fakes;
    cio_buffered_stream_read_at_least_fake.custom_fake_seq_len = 5;
    cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Could not start reading a message!",0x48e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (2,(ulong)read_handler_fake.call_count,"read_handler was not called",0x490,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
               "websocket parameter of read_handler not correct",0x491,UNITY_DISPLAY_STYLE_HEX64);
    if (read_handler_fake.arg1_val != (void *)0x0) break;
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not correct",
               0x493,UNITY_DISPLAY_STYLE_INT);
    if (read_handler_fake.arg4_val != (uint8_t *)0x0) {
      UnityFail("data parameter of read_handler not correct",0x494);
    }
    UnityAssertEqualNumber
              (0,read_handler_fake.arg5_val,"length parameter of read_handler not correct",0x495,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x497,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "ws parameter in error callback not correct",0x498,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (-0x62,(long)on_error_fake.arg1_val,"error callback called with wrong status code",
               0x499,UNITY_DISPLAY_STYLE_INT);
    free(ws);
    setUp();
    lVar2 = lVar2 + 4;
  }
  UnityFail("context parameter of read_handler not correct",0x492);
}

Assistant:

static void test_immediate_read_error_for_second_get_payload(void)
{
	enum cio_websocket_frame_type frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};

	for (unsigned int i = 0; i < ARRAY_SIZE(frame_types); i++) {
		enum cio_websocket_frame_type frame_type = frame_types[i];

		char data[5];
		memset(data, 'a', sizeof(data));
		struct ws_frame frames[] = {
		    {.frame_type = frame_type, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
		    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
		};

		serialize_frames(frames, ARRAY_SIZE(frames));
		enum cio_error (*read_at_least_fakes[])(struct cio_buffered_stream *, struct cio_read_buffer *, size_t, cio_buffered_stream_read_handler_t, void *) = {
		    bs_read_at_least_from_buffer,
		    bs_read_at_least_from_buffer,
		    bs_read_at_least_from_buffer,
		    bs_read_at_least_from_buffer,
		    bs_read_at_least_immediate_error};

		SET_CUSTOM_FAKE_SEQ(cio_buffered_stream_read_at_least, read_at_least_fakes, ARRAY_SIZE(read_at_least_fakes))

		enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

		TEST_ASSERT_EQUAL_MESSAGE(2, read_handler_fake.call_count, "read_handler was not called");
		TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg4_val, "data parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(0, read_handler_fake.arg5_val, "length parameter of read_handler not correct");

		TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
		TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in error callback not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_ADDRESS_IN_USE, on_error_fake.arg1_val, "error callback called with wrong status code");

		free(ws);
		setUp();
	}
}